

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpinfo.c
# Opt level: O2

WebPInfoStatus
ParseLosslessTransform(WebPInfo *webp_info,uint8_t *data,size_t data_size,uint64_t *bit_pos)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  int local_3c;
  int type;
  int use_transform;
  
  iVar1 = LLGetBits(data,data_size,1,&use_transform,bit_pos);
  if (iVar1 == 0) {
    if (webp_info->show_diagnosis_ != 0) {
      fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
      return WEBP_INFO_TRUNCATED_DATA;
    }
    return WEBP_INFO_TRUNCATED_DATA;
  }
  pcVar3 = "Yes";
  if (use_transform == 0) {
    pcVar3 = "No";
  }
  printf("  Use transform:    %s\n",pcVar3);
  if (use_transform == 0) {
    return WEBP_INFO_OK;
  }
  iVar1 = LLGetBits(data,data_size,2,&type,bit_pos);
  if (iVar1 != 0) {
    printf("  1st transform:    %s (%d)\n",
           kLosslessTransforms_rel + *(int *)(kLosslessTransforms_rel + (long)type * 4),
           (ulong)(uint)type);
    if ((ulong)(long)type < 2) {
      iVar1 = LLGetBits(data,data_size,3,&local_3c,bit_pos);
      if (iVar1 == 0) goto LAB_00104a19;
      uVar2 = 1 << ((char)local_3c + 2U & 0x1f);
      pcVar3 = "  Tran. block size: %d\n";
    }
    else {
      if (type != 3) {
        return WEBP_INFO_OK;
      }
      iVar1 = LLGetBits(data,data_size,8,&local_3c,bit_pos);
      if (iVar1 == 0) goto LAB_00104a19;
      uVar2 = local_3c + 1;
      pcVar3 = "  No. of colors:    %d\n";
    }
    printf(pcVar3,(ulong)uVar2);
    return WEBP_INFO_OK;
  }
LAB_00104a19:
  if (webp_info->show_diagnosis_ != 0) {
    fprintf(_stderr,"Error: %s\n","Truncated lossless bitstream.");
  }
  return WEBP_INFO_TRUNCATED_DATA;
}

Assistant:

static WebPInfoStatus ParseLosslessTransform(WebPInfo* const webp_info,
                                             const uint8_t* const data,
                                             size_t data_size,
                                             uint64_t* const  bit_pos) {
  int use_transform, block_size, n_colors;
  LL_GET_BITS(use_transform, 1);
  printf("  Use transform:    %s\n", use_transform ? "Yes" : "No");
  if (use_transform) {
    int type;
    LL_GET_BITS(type, 2);
    printf("  1st transform:    %s (%d)\n", kLosslessTransforms[type], type);
    switch (type) {
      case PREDICTOR_TRANSFORM:
      case CROSS_COLOR_TRANSFORM:
        LL_GET_BITS(block_size, 3);
        block_size = 1 << (block_size + 2);
        printf("  Tran. block size: %d\n", block_size);
        break;
      case COLOR_INDEXING_TRANSFORM:
        LL_GET_BITS(n_colors, 8);
        n_colors += 1;
        printf("  No. of colors:    %d\n", n_colors);
        break;
      default: break;
    }
  }
  return WEBP_INFO_OK;
}